

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_NodeRef_rec(Gia_Man_t *p,Gia_Obj_t *pNode,int fMark)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = (uint)*(undefined8 *)pNode;
  iVar3 = 0;
  if ((~uVar1 & 0x9fffffff) != 0) {
    if (((int)uVar1 < 0) || (uVar1 = uVar1 & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x456,"int Gia_NodeRef_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    if (fMark != 0) {
      Gia_ObjSetTravIdCurrent(p,pNode);
      uVar1 = (uint)*(undefined8 *)pNode & 0x1fffffff;
    }
    iVar2 = Gia_ObjRefInc(p,pNode + -(ulong)uVar1);
    iVar3 = 0;
    if (iVar2 == 0) {
      iVar3 = Gia_NodeRef_rec(p,pNode + -(ulong)uVar1,fMark);
    }
    uVar1 = *(uint *)&pNode->field_0x4;
    iVar2 = Gia_ObjRefInc(p,pNode + -(ulong)(uVar1 & 0x1fffffff));
    if (iVar2 == 0) {
      iVar2 = Gia_NodeRef_rec(p,pNode + -(ulong)(uVar1 & 0x1fffffff),fMark);
      iVar3 = iVar3 + iVar2;
    }
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int Gia_NodeRef_rec( Gia_Man_t * p, Gia_Obj_t * pNode, int fMark )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    if ( fMark ) Gia_ObjSetTravIdCurrent(p, pNode);
    pFanin = Gia_ObjFanin0(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    pFanin = Gia_ObjFanin1(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    return Counter + 1;
}